

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddBYEPacket
          (RTCPCompoundPacketBuilder *this,uint32_t *ssrcs,uint8_t numssrcs,void *reasondata,
          uint8_t reasonlength)

{
  uint8_t *puVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  RTPMemoryManager *pRVar5;
  int iVar6;
  _List_node_base *p_Var7;
  size_t sVar8;
  size_t sVar9;
  _List_node_base *p_Var10;
  ulong uVar11;
  _List_node_base *p_Var12;
  ushort uVar13;
  size_t local_48;
  
  iVar6 = -0x2a;
  if ((this->arebuilding == true) && (iVar6 = -0x2d, numssrcs < 0x20)) {
    p_Var12 = (_List_node_base *)((ulong)numssrcs * 4 + 4);
    if (reasonlength == '\0') {
      local_48 = 0;
      p_Var7 = p_Var12;
    }
    else {
      uVar11 = (ulong)(reasonlength + 1 & 3);
      local_48 = 4 - uVar11;
      if (uVar11 == 0) {
        local_48 = 0;
      }
      p_Var7 = (_List_node_base *)((long)&p_Var12->_M_next + local_48 + (uint)reasonlength + 1);
    }
    sVar3 = this->appsize;
    sVar4 = this->byesize;
    sVar8 = SDES::NeededBytes(&this->sdes);
    sVar9 = Report::NeededBytes(&this->report);
    iVar6 = -0x2b;
    if ((long)&p_Var7->_M_next + sVar9 + sVar8 + sVar4 + sVar3 <= this->maximumpacketsize) {
      pRVar5 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
      if (pRVar5 == (RTPMemoryManager *)0x0) {
        p_Var10 = (_List_node_base *)operator_new__((ulong)p_Var7);
      }
      else {
        p_Var10 = (_List_node_base *)(**(code **)(*(long *)pRVar5 + 0x10))(pRVar5,p_Var7,4);
        if (p_Var10 == (_List_node_base *)0x0) {
          return -1;
        }
      }
      uVar13 = (short)((ulong)p_Var7 >> 2) - 1;
      *(byte *)&p_Var10->_M_next = numssrcs | 0x80;
      *(ushort *)((long)&p_Var10->_M_next + 2) = uVar13 * 0x100 | uVar13 >> 8;
      *(undefined1 *)((long)&p_Var10->_M_next + 1) = 0xcb;
      if (numssrcs != '\0') {
        uVar11 = 0;
        do {
          uVar2 = ssrcs[uVar11];
          *(uint *)((long)&p_Var10->_M_next + uVar11 * 4 + 4) =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          uVar11 = uVar11 + 1;
        } while (numssrcs != uVar11);
      }
      if (reasonlength != '\0') {
        puVar1 = (uint8_t *)((long)&p_Var12->_M_next + (long)&p_Var10->_M_next);
        *puVar1 = reasonlength;
        memcpy(puVar1 + 1,reasondata,(ulong)reasonlength);
        if (local_48 != 0) {
          memset((void *)((long)p_Var10 + ((long)p_Var7 - local_48)),0,local_48);
        }
      }
      p_Var12 = (_List_node_base *)operator_new(0x20);
      p_Var12[1]._M_next = p_Var10;
      p_Var12[1]._M_prev = p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      sVar3 = this->byesize;
      (this->byepackets).
      super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
      ._M_impl._M_node._M_size =
           (this->byepackets).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
           ._M_impl._M_node._M_size + 1;
      this->byesize = (long)&p_Var7->_M_next + sVar3;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int RTCPCompoundPacketBuilder::AddBYEPacket(uint32_t *ssrcs,uint8_t numssrcs,const void *reasondata,uint8_t reasonlength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

	if (numssrcs > 31)
		return ERR_RTP_RTCPCOMPPACKBUILDER_TOOMANYSSRCS;
	
	size_t packsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)*((size_t)numssrcs);
	size_t zerobytes = 0;
	
	if (reasonlength > 0)
	{
		packsize += 1; // 1 byte for the length;
		packsize += (size_t)reasonlength;

		size_t r = (packsize&0x03);
		if (r != 0)
		{
			zerobytes = 4-r;
			packsize += zerobytes;
		}
	}

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = appsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#else
	size_t totalotherbytes = appsize+unknownsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	if ((totalotherbytes + packsize) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t numwords;
	
	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPBYEPACKET) uint8_t[packsize];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;

	RTCPCommonHeader *hdr = (RTCPCommonHeader *)buf;

	hdr->version = 2;
	hdr->padding = 0;
	hdr->count = numssrcs;
	
	numwords = packsize/sizeof(uint32_t);
	hdr->length = htons((uint16_t)(numwords-1));
	hdr->packettype = RTP_RTCPTYPE_BYE;
	
	uint32_t *sources = (uint32_t *)(buf+sizeof(RTCPCommonHeader));
	uint8_t srcindex;
	
	for (srcindex = 0 ; srcindex < numssrcs ; srcindex++)
		sources[srcindex] = htonl(ssrcs[srcindex]);

	if (reasonlength != 0)
	{
		size_t offset = sizeof(RTCPCommonHeader)+((size_t)numssrcs)*sizeof(uint32_t);

		buf[offset] = reasonlength;
		memcpy((buf+offset+1),reasondata,(size_t)reasonlength);
		for (size_t i = 0 ; i < zerobytes ; i++)
			buf[packsize-1-i] = 0;
	}

	byepackets.push_back(Buffer(buf,packsize));
	byesize += packsize;
	
	return 0;
}